

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

bool __thiscall higan::HttpRequest::SetVersion(HttpRequest *this,char *begin,char *end)

{
  HttpVersion HVar1;
  bool bVar2;
  undefined1 local_38 [8];
  string version;
  
  local_38 = (undefined1  [8])&version._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"HTTP/1.0");
  if (bVar2) {
    HVar1 = HTTP_VERSION_10;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"HTTP/1.1");
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0011ffdf;
    }
    HVar1 = HTTP_VERSION_11;
  }
  this->version_ = HVar1;
  bVar2 = true;
LAB_0011ffdf:
  std::__cxx11::string::~string((string *)local_38);
  return bVar2;
}

Assistant:

bool HttpRequest::SetVersion(const char* begin, const char* end)
{
	std::string version(begin, end);

	if (version == "HTTP/1.0")
	{
		version_ = HTTP_VERSION_10;
	}
	else if (version == "HTTP/1.1")
	{
		version_ = HTTP_VERSION_11;
	}
	else
	{
		return false;
	}

	return true;
}